

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::RecordCrossFrameEntryExitRecord
          (FunctionBody *this,uint byteCodeOffset,bool isEnterBlock)

{
  Type *addr;
  Type *pTVar1;
  int iVar2;
  AuxStatementData *pAVar3;
  Recycler *this_00;
  CrossFrameEntryExitRecord *pCVar4;
  code *pcVar5;
  bool bVar6;
  Recycler *alloc;
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  undefined4 *puVar8;
  undefined1 local_60 [8];
  CrossFrameEntryExitRecord record;
  
  EnsureAuxStatementData(this);
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if ((pAVar3 == (AuxStatementData *)0x0) ||
     ((pAVar3->m_crossFrameBlockEntryExisRecords).ptr ==
      (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    local_60 = (undefined1  [8])
               &JsUtil::
                List<Js::FunctionBody::CrossFrameEntryExitRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    record.m_byteCodeOffset = 0;
    record.m_isEnterBlock = false;
    record._5_3_ = 0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
    pLVar7 = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
    (pLVar7->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (CrossFrameEntryExitRecord *)0x0;
    (pLVar7->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    (pLVar7->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (pLVar7->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f0750;
    pLVar7->length = 0;
    pLVar7->increment = 4;
    pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
    addr = &pAVar3->m_crossFrameBlockEntryExisRecords;
    Memory::Recycler::WBSetBit((char *)addr);
    (pAVar3->m_crossFrameBlockEntryExisRecords).ptr = pLVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  if ((pAVar3 == (AuxStatementData *)0x0) ||
     ((pAVar3->m_crossFrameBlockEntryExisRecords).ptr ==
      (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1f6a,"(this->GetCrossFrameEntryExitRecords())",
                                "this->GetCrossFrameEntryExitRecords()");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  CrossFrameEntryExitRecord::CrossFrameEntryExitRecord
            ((CrossFrameEntryExitRecord *)local_60,byteCodeOffset,isEnterBlock);
  pAVar3 = (this->m_sourceInfo).m_auxStatementData.ptr;
  if (pAVar3 == (AuxStatementData *)0x0) {
    pLVar7 = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
  }
  else {
    pLVar7 = (pAVar3->m_crossFrameBlockEntryExisRecords).ptr;
  }
  JsUtil::
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar7,0);
  pCVar4 = (pLVar7->
           super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr;
  iVar2 = (pLVar7->
          super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
          ).count;
  pCVar4[iVar2].m_isEnterBlock = local_60[4];
  pCVar4[iVar2].m_byteCodeOffset = local_60._0_4_;
  pTVar1 = &(pLVar7->
            super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void FunctionBody::RecordCrossFrameEntryExitRecord(uint byteCodeOffset, bool isEnterBlock)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetCrossFrameEntryExitRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_crossFrameBlockEntryExisRecords = RecyclerNew(recycler, CrossFrameEntryExitRecordList, recycler);
        }
        Assert(this->GetCrossFrameEntryExitRecords());

        CrossFrameEntryExitRecord record(byteCodeOffset, isEnterBlock);
        this->GetCrossFrameEntryExitRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }